

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_originator.c
# Opt level: O1

void olsrv2_originator_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  plVar2 = (_originator_set_tree.list_head.next)->prev;
  plVar3 = _originator_set_tree.list_head.next;
  while (plVar2 != _originator_set_tree.list_head.prev) {
    plVar1 = plVar3->next;
    _remove_originator_entry((olsrv2_originator_set_entry *)&plVar3[-2].prev);
    plVar3 = plVar1;
    plVar2 = plVar1->prev;
  }
  oonf_timer_remove(&_originator_entry_timer);
  oonf_class_remove(&_originator_entry_class);
  return;
}

Assistant:

void
olsrv2_originator_cleanup(void) {
  struct olsrv2_originator_set_entry *entry, *e_it;

  /* remove all originator entries */
  avl_for_each_element_safe(&_originator_set_tree, entry, _node, e_it) {
    _remove_originator_entry(entry);
  }

  /* remove timer and class */
  oonf_timer_remove(&_originator_entry_timer);
  oonf_class_remove(&_originator_entry_class);
}